

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.c
# Opt level: O0

int compare_timers(void *av,void *bv)

{
  long lVar1;
  long lVar2;
  int c;
  long bt;
  long at;
  timer *b;
  timer *a;
  void *bv_local;
  void *av_local;
  
  lVar1 = *(long *)((long)av + 0x10) - now;
  lVar2 = *(long *)((long)bv + 0x10) - now;
  if (lVar1 < lVar2) {
    av_local._4_4_ = -1;
  }
  else if (lVar2 < lVar1) {
    av_local._4_4_ = 1;
  }
  else {
    av_local._4_4_ = memcmp(av,bv,8);
    if (av_local._4_4_ == 0) {
      if (*(ulong *)((long)av + 8) < *(ulong *)((long)bv + 8)) {
        av_local._4_4_ = -1;
      }
      else if (*(ulong *)((long)bv + 8) < *(ulong *)((long)av + 8)) {
        av_local._4_4_ = 1;
      }
      else {
        av_local._4_4_ = 0;
      }
    }
  }
  return av_local._4_4_;
}

Assistant:

static int compare_timers(void *av, void *bv)
{
    struct timer *a = (struct timer *)av;
    struct timer *b = (struct timer *)bv;
    long at = a->now - now;
    long bt = b->now - now;

    if (at < bt)
        return -1;
    else if (at > bt)
        return +1;

    /*
     * Failing that, compare on the other two fields, just so that
     * we don't get unwanted equality.
     */
#if defined(__LCC__) || defined(__clang__)
    /* lcc won't let us compare function pointers. Legal, but annoying. */
    {
        int c = memcmp(&a->fn, &b->fn, sizeof(a->fn));
        if (c)
            return c;
    }
#else
    if (a->fn < b->fn)
        return -1;
    else if (a->fn > b->fn)
        return +1;
#endif

    if (a->ctx < b->ctx)
        return -1;
    else if (a->ctx > b->ctx)
        return +1;

    /*
     * Failing _that_, the two entries genuinely are equal, and we
     * never have a need to store them separately in the tree.
     */
    return 0;
}